

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O2

void __thiscall
de::cmdline::detail::TypedFieldMap::set(TypedFieldMap *this,type_info *key,Entry *value)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  type_info *local_38;
  pair<const_std::type_info_*,_de::cmdline::detail::TypedFieldMap::Entry> local_30;
  
  local_38 = key;
  iVar2 = std::
          _Rb_tree<const_std::type_info_*,_std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>,_std::_Select1st<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>,_std::less<const_std::type_info_*>,_std::allocator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>_>
          ::find((_Rb_tree<const_std::type_info_*,_std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>,_std::_Select1st<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>,_std::less<const_std::type_info_*>,_std::allocator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>_>
                  *)this,&local_38);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->m_fields)._M_t._M_impl.super__Rb_tree_header) {
    local_30.first = local_38;
    local_30.second.value = value->value;
    local_30.second.destructor = value->destructor;
    std::
    _Rb_tree<std::type_info_const*,std::pair<std::type_info_const*const,de::cmdline::detail::TypedFieldMap::Entry>,std::_Select1st<std::pair<std::type_info_const*const,de::cmdline::detail::TypedFieldMap::Entry>>,std::less<std::type_info_const*>,std::allocator<std::pair<std::type_info_const*const,de::cmdline::detail::TypedFieldMap::Entry>>>
    ::_M_emplace_unique<std::pair<std::type_info_const*,de::cmdline::detail::TypedFieldMap::Entry>>
              ((_Rb_tree<std::type_info_const*,std::pair<std::type_info_const*const,de::cmdline::detail::TypedFieldMap::Entry>,std::_Select1st<std::pair<std::type_info_const*const,de::cmdline::detail::TypedFieldMap::Entry>>,std::less<std::type_info_const*>,std::allocator<std::pair<std::type_info_const*const,de::cmdline::detail::TypedFieldMap::Entry>>>
                *)this,&local_30);
  }
  else {
    (*(code *)iVar2._M_node[1]._M_left)(iVar2._M_node[1]._M_parent);
    iVar2._M_node[1]._M_parent = (_Base_ptr)0x0;
    p_Var1 = (_Base_ptr)value->destructor;
    iVar2._M_node[1]._M_parent = (_Base_ptr)value->value;
    iVar2._M_node[1]._M_left = p_Var1;
  }
  return;
}

Assistant:

void TypedFieldMap::set (const std::type_info* key, const Entry& value)
{
	Map::iterator pos = m_fields.find(key);

	if (pos != m_fields.end())
	{
		pos->second.destructor(pos->second.value);
		pos->second.value = DE_NULL;

		pos->second = value;
	}
	else
		m_fields.insert(std::make_pair(key, value));
}